

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_external_decode_block
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out_,int *out_size)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  cram_block *pcVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  double dVar13;
  
  if (slice->block_by_id == (cram_block **)0x0) {
    uVar1 = slice->hdr->num_blocks;
    if ((int)uVar1 < 1) {
      uVar10 = 0;
      pcVar7 = (cram_block *)0x0;
    }
    else {
      uVar10 = 0;
      do {
        pcVar7 = slice->block[uVar10];
        if (((pcVar7 != (cram_block *)0x0) && (pcVar7->content_type == EXTERNAL)) &&
           (pcVar7->content_id == (c->field_6).huffman.ncodes)) goto LAB_0015207f;
        uVar10 = uVar10 + 1;
      } while (uVar1 != uVar10);
      uVar10 = (ulong)uVar1;
    }
LAB_0015207f:
    if ((uint)uVar10 == uVar1) {
      return -1;
    }
    if (pcVar7 == (cram_block *)0x0) {
      return -1;
    }
  }
  else {
    pcVar7 = slice->block_by_id[(c->field_6).huffman.ncodes];
    if (pcVar7 == (cram_block *)0x0) {
      return -(uint)(*out_size != 0);
    }
  }
  puVar3 = pcVar7->data;
  iVar2 = pcVar7->idx;
  iVar4 = *out_size + iVar2;
  pcVar7->idx = iVar4;
  iVar5 = -1;
  if (puVar3 != (uchar *)0x0 && iVar4 <= pcVar7->uncomp_size) {
    uVar10 = *(ulong *)(out_ + 0x28);
    lVar11 = *(long *)(out_ + 0x30);
    sVar9 = (size_t)*out_size;
    if (uVar10 <= lVar11 + sVar9) {
      do {
        auVar12._8_4_ = (int)(uVar10 >> 0x20);
        auVar12._0_8_ = uVar10;
        auVar12._12_4_ = 0x45300000;
        dVar13 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) * 1.5;
        uVar8 = (ulong)dVar13;
        sVar9 = (long)(dVar13 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        if (uVar10 == 0) {
          sVar9 = 0x400;
        }
        *(size_t *)(out_ + 0x28) = sVar9;
        pvVar6 = realloc(*(void **)(out_ + 0x20),sVar9);
        *(void **)(out_ + 0x20) = pvVar6;
        uVar10 = *(ulong *)(out_ + 0x28);
        lVar11 = *(long *)(out_ + 0x30);
        sVar9 = (size_t)*out_size;
      } while (uVar10 <= lVar11 + sVar9);
    }
    memcpy((void *)(lVar11 + *(long *)(out_ + 0x20)),puVar3 + iVar2,sVar9);
    *(long *)(out_ + 0x30) = *(long *)(out_ + 0x30) + (long)*out_size;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int cram_external_decode_block(cram_slice *slice, cram_codec *c,
				      cram_block *in, char *out_,
				      int *out_size) {
    int i;
    char *cp;
    cram_block *b = NULL;
    cram_block *out = (cram_block *)out_;

    /* Find the external block */
    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->external.content_id]))
	    return *out_size?-1:0;
    } else {
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->external.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    cp = cram_extract_block(b, *out_size);
    if (!cp)
	return -1;

    BLOCK_APPEND(out, cp, *out_size);
    return 0;
}